

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O3

void __thiscall QWidgetWindow::scheduleRepaint(QWidgetWindow *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QWidgetData *pQVar5;
  long lVar6;
  QWidget *pQVar7;
  int iVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  QRect local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = QWindow::screen();
  if ((lVar6 != 0) && ((this->m_widget).wp.d != (Data *)0x0)) {
    pQVar7 = (QWidget *)(this->m_widget).wp.value;
    pQVar5 = pQVar7->data;
    if (((short)pQVar5->widget_attributes < 0) &&
       (((pQVar5->widget_attributes >> 10 & 1) == 0 &&
        (uVar1 = (pQVar5->crect).x2, uVar3 = (pQVar5->crect).y2, uVar2 = (pQVar5->crect).x1,
        uVar4 = (pQVar5->crect).y1, auVar9._0_4_ = -(uint)(-1 < (int)(uVar1 - uVar2)),
        auVar9._4_4_ = -(uint)(-1 < (int)(uVar1 - uVar2)),
        auVar9._8_4_ = -(uint)(-1 < (int)(uVar3 - uVar4)),
        auVar9._12_4_ = -(uint)(-1 < (int)(uVar3 - uVar4)), iVar8 = movmskpd((int)pQVar5,auVar9),
        iVar8 == 3)))) {
      pQVar7 = QWidget::window(pQVar7);
      lVar6 = *(long *)(*(long *)&pQVar7->field_0x8 + 0x78);
      if ((lVar6 != 0) &&
         ((lVar6 = *(long *)(lVar6 + 8), lVar6 != 0 && (*(long *)(lVar6 + 0x10) != 0)))) {
        pQVar7 = (QWidget *)(this->m_widget).wp.value;
        pQVar5 = pQVar7->data;
        local_20.x2.m_i = (pQVar5->crect).x2.m_i - (pQVar5->crect).x1.m_i;
        local_20.y2.m_i = (pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i;
        local_20.x1.m_i = 0;
        local_20.y1.m_i = 0;
        if (*(int *)((this->m_widget).wp.d + 4) == 0) {
          pQVar7 = (QWidget *)0x0;
        }
        QWidgetRepaintManager::markDirty<QRect>
                  (*(QWidgetRepaintManager **)(lVar6 + 8),&local_20,pQVar7,UpdateLater,BufferInvalid
                  );
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::scheduleRepaint()
{
    if (!screen())
        return;

    if (!m_widget->isVisible() || !m_widget->updatesEnabled() || !m_widget->rect().isValid())
        return;

    QTLWExtra *tlwExtra = m_widget->window()->d_func()->maybeTopData();
    if (tlwExtra && tlwExtra->backingStore) {
        tlwExtra->repaintManager->markDirty(m_widget->rect(), m_widget,
            QWidgetRepaintManager::UpdateLater, QWidgetRepaintManager::BufferInvalid);
    }
}